

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_leave(DisasContext *s)

{
  TCGContext *tcg_ctx_00;
  MemOp ot;
  MemOp aflag;
  MemOp a_ot;
  MemOp d_ot;
  TCGContext *tcg_ctx;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ot = mo_pushpop(s,s->dflag);
  aflag = mo_stacksize(s);
  gen_lea_v_seg(s,aflag,tcg_ctx_00->cpu_regs[5],2,-1);
  gen_op_ld_v(s,ot,s->T0,s->A0);
  tcg_gen_addi_i64_x86_64(tcg_ctx_00,s->T1,tcg_ctx_00->cpu_regs[5],1L << ((byte)ot & 0x3f));
  gen_op_mov_reg_v(s,ot,5,s->T0);
  gen_op_mov_reg_v(s,aflag,4,s->T1);
  return;
}

Assistant:

static void gen_leave(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    MemOp d_ot = mo_pushpop(s, s->dflag);
    MemOp a_ot = mo_stacksize(s);

    gen_lea_v_seg(s, a_ot, tcg_ctx->cpu_regs[R_EBP], R_SS, -1);
    gen_op_ld_v(s, d_ot, s->T0, s->A0);

    tcg_gen_addi_tl(tcg_ctx, s->T1, tcg_ctx->cpu_regs[R_EBP], 1ULL << d_ot);

    gen_op_mov_reg_v(s, d_ot, R_EBP, s->T0);
    gen_op_mov_reg_v(s, a_ot, R_ESP, s->T1);
}